

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O2

void re2::SearchCachedDFA(int iters,char *regexp,StringPiece *text,Anchor anchor,bool expect_match)

{
  Regexp *this;
  Prog *this_00;
  bool bVar1;
  bool failed;
  Regexp *local_1b8;
  LogMessageFatal local_1b0;
  
  StringPiece::StringPiece((StringPiece *)&local_1b0,regexp);
  this = Regexp::Parse((StringPiece *)&local_1b0,LikePerl,(RegexpStatus *)0x0);
  if (this == (Regexp *)0x0) {
    LogMessageFatal::LogMessageFatal
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
               ,0x3c6);
    std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,"Check failed: re");
    LogMessageFatal::~LogMessageFatal(&local_1b0);
  }
  this_00 = Regexp::CompileToProg(this,0x80000000);
  if (this_00 == (Prog *)0x0) {
    LogMessageFatal::LogMessageFatal
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
               ,0x3c8);
    std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,"Check failed: prog");
    LogMessageFatal::~LogMessageFatal(&local_1b0);
  }
  if (iters < 1) {
    iters = 0;
  }
  local_1b8 = this;
  while (bVar1 = iters != 0, iters = iters + -1, bVar1) {
    local_1b0.super_LogMessage._0_8_ = (char *)0x0;
    failed = false;
    local_1b0.super_LogMessage._8_4_ = 0;
    bVar1 = Prog::SearchDFA(this_00,text,(StringPiece *)&local_1b0,anchor,kFirstMatch,
                            (StringPiece *)0x0,&failed,(vector<int,_std::allocator<int>_> *)0x0);
    if (bVar1 != expect_match) {
      LogMessageFatal::LogMessageFatal
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                 ,0x3cd);
      std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,
                      "Check failed: (prog->SearchDFA(text, __null, anchor, Prog::kFirstMatch, __null, &failed, __null)) == (expect_match)"
                     );
      LogMessageFatal::~LogMessageFatal(&local_1b0);
    }
    if (failed == true) {
      LogMessageFatal::LogMessageFatal
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                 ,0x3ce);
      std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,"Check failed: !failed");
      LogMessageFatal::~LogMessageFatal(&local_1b0);
    }
  }
  if (this_00 != (Prog *)0x0) {
    Prog::~Prog(this_00);
  }
  operator_delete(this_00);
  Regexp::Decref(local_1b8);
  return;
}

Assistant:

void SearchCachedDFA(int iters, const char* regexp, const StringPiece& text,
                     Prog::Anchor anchor, bool expect_match) {
  Regexp* re = Regexp::Parse(regexp, Regexp::LikePerl, NULL);
  CHECK(re);
  Prog* prog = re->CompileToProg(1LL<<31);
  CHECK(prog);
  for (int i = 0; i < iters; i++) {
    bool failed = false;
    CHECK_EQ(prog->SearchDFA(text, NULL, anchor,
                             Prog::kFirstMatch, NULL, &failed, NULL),
             expect_match);
    CHECK(!failed);
  }
  delete prog;
  re->Decref();
}